

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::Compiler::is_hidden_variable
          (Compiler *this,SPIRVariable *var,bool include_builtins)

{
  CombinedImageSampler *pCVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t uVar4;
  long lVar5;
  const_iterator cVar6;
  CombinedImageSampler *pCVar7;
  long lVar8;
  key_type local_1c;
  
  bVar3 = is_builtin_variable(this,var);
  if (bVar3 && !include_builtins) {
    return true;
  }
  if (var->remapped_variable != false) {
    return true;
  }
  pCVar7 = (this->combined_image_samplers).
           super_VectorView<diligent_spirv_cross::CombinedImageSampler>.ptr;
  sVar2 = (this->combined_image_samplers).
          super_VectorView<diligent_spirv_cross::CombinedImageSampler>.buffer_size;
  lVar5 = sVar2 * 0xc;
  pCVar1 = pCVar7 + sVar2;
  uVar4 = (var->super_IVariant).self.id;
  for (lVar8 = (long)sVar2 >> 2; 0 < lVar8; lVar8 = lVar8 + -1) {
    if ((pCVar7->combined_id).id == uVar4) goto LAB_002c3cfd;
    if (pCVar7[1].combined_id.id == uVar4) {
      pCVar7 = pCVar7 + 1;
      goto LAB_002c3cfd;
    }
    if (pCVar7[2].combined_id.id == uVar4) {
      pCVar7 = pCVar7 + 2;
      goto LAB_002c3cfd;
    }
    if (pCVar7[3].combined_id.id == uVar4) {
      pCVar7 = pCVar7 + 3;
      goto LAB_002c3cfd;
    }
    pCVar7 = pCVar7 + 4;
    lVar5 = lVar5 + -0x30;
  }
  lVar5 = lVar5 / 0xc;
  if (lVar5 == 1) {
LAB_002c3ce7:
    if ((pCVar7->combined_id).id != uVar4) goto LAB_002c3d02;
  }
  else if (lVar5 == 2) {
LAB_002c3cdf:
    if ((pCVar7->combined_id).id != uVar4) {
      pCVar7 = pCVar7 + 1;
      goto LAB_002c3ce7;
    }
  }
  else {
    if (lVar5 != 3) goto LAB_002c3d02;
    if ((pCVar7->combined_id).id != uVar4) {
      pCVar7 = pCVar7 + 1;
      goto LAB_002c3cdf;
    }
  }
LAB_002c3cfd:
  if (pCVar7 != pCVar1) {
    return false;
  }
LAB_002c3d02:
  uVar4 = ParsedIR::get_spirv_version(&this->ir);
  if (((0x103ff < uVar4) && (1 < var->storage - Function)) &&
     (bVar3 = interface_variable_exists_in_entry_point(this,(var->super_IVariant).self.id), !bVar3))
  {
    return true;
  }
  if (this->check_active_interface_variables != true) {
    return false;
  }
  if (var->storage < (StorageBuffer|Input)) {
    if ((0x160fU >> (var->storage & 0x1f) & 1) != 0) {
      local_1c.id = (var->super_IVariant).self.id;
      cVar6 = ::std::
              _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(this->active_interface_variables)._M_h,&local_1c);
      return cVar6.
             super__Node_iterator_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_true>
             ._M_cur == (__node_type *)0x0;
    }
    return false;
  }
  return false;
}

Assistant:

bool Compiler::is_hidden_variable(const SPIRVariable &var, bool include_builtins) const
{
	if ((is_builtin_variable(var) && !include_builtins) || var.remapped_variable)
		return true;

	// Combined image samplers are always considered active as they are "magic" variables.
	if (find_if(begin(combined_image_samplers), end(combined_image_samplers), [&var](const CombinedImageSampler &samp) {
		    return samp.combined_id == var.self;
	    }) != end(combined_image_samplers))
	{
		return false;
	}

	// In SPIR-V 1.4 and up we must also use the active variable interface to disable global variables
	// which are not part of the entry point.
	if (ir.get_spirv_version() >= 0x10400 && var.storage != spv::StorageClassGeneric &&
	    var.storage != spv::StorageClassFunction && !interface_variable_exists_in_entry_point(var.self))
	{
		return true;
	}

	return check_active_interface_variables && storage_class_is_interface(var.storage) &&
	       active_interface_variables.find(var.self) == end(active_interface_variables);
}